

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationsets.cpp
# Opt level: O3

void __thiscall
icu_63::TailoredSet::addPrefixes(TailoredSet *this,CollationData *d,UChar32 c,UChar *p)

{
  UBool UVar1;
  Iterator prefixes;
  ConstChar16Ptr local_c0;
  UChar *local_b8;
  Iterator local_a8;
  
  local_c0.p_ = p;
  UCharsTrie::Iterator::Iterator(&local_a8,&local_c0,0,&this->errorCode);
  local_b8 = local_c0.p_;
  while( true ) {
    UVar1 = UCharsTrie::Iterator::next(&local_a8,&this->errorCode);
    if (UVar1 == '\0') break;
    addPrefix(this,d,&local_a8.str_,c,local_a8.value_);
  }
  UCharsTrie::Iterator::~Iterator(&local_a8);
  return;
}

Assistant:

void
TailoredSet::addPrefixes(const CollationData *d, UChar32 c, const UChar *p) {
    UCharsTrie::Iterator prefixes(p, 0, errorCode);
    while(prefixes.next(errorCode)) {
        addPrefix(d, prefixes.getString(), c, (uint32_t)prefixes.getValue());
    }
}